

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O3

REF_STATUS ref_sort_shuffle(REF_INT n,REF_INT *permutation)

{
  uint uVar1;
  REF_INT RVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar3 = _DAT_00210ac0;
  if (0 < n) {
    lVar7 = (ulong)(uint)n - 1;
    auVar9._8_4_ = (int)lVar7;
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar9 = auVar9 ^ _DAT_00210ac0;
    auVar10 = _DAT_00210ab0;
    do {
      auVar11 = auVar10 ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        permutation[uVar8] = (int)uVar8;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        permutation[uVar8 + 1] = (int)uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar7 + 2;
    } while ((n + 1U & 0xfffffffe) != uVar8);
    if (n != 1) {
      uVar1 = n - 1;
      uVar8 = 0;
      do {
        iVar4 = rand();
        uVar5 = (uint)uVar8 + iVar4 % n;
        if ((int)uVar1 <= (int)uVar5) {
          uVar5 = uVar1;
        }
        uVar6 = (uint)uVar8;
        if (-1 < iVar4 % n) {
          uVar6 = uVar5;
        }
        RVar2 = permutation[(int)uVar6];
        permutation[(int)uVar6] = permutation[uVar8];
        permutation[uVar8] = RVar2;
        uVar8 = uVar8 + 1;
        n = n + -1;
      } while (uVar1 != uVar8);
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_shuffle(REF_INT n, REF_INT *permutation) {
  REF_INT i, j, temp;
  for (i = 0; i < n; i++) permutation[i] = i;
  for (i = 0; i < n - 1; i++) {
    j = rand() % (n - 1 - i + 1) + i; /* i <= j < n */
    j = MAX(i, MIN(j, n - 1));        /* not needed, but don't trust myself */
    temp = permutation[j];
    permutation[j] = permutation[i];
    permutation[i] = temp;
  }
  return REF_SUCCESS;
}